

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstylesheetstyle.cpp
# Opt level: O2

void __thiscall
QRenderRule::QRenderRule(QRenderRule *this,QList<QCss::Declaration> *declarations,QObject *object)

{
  QFont *this_00;
  QSharedDataPointer<QStyleSheetBackgroundData> *this_01;
  QSharedDataPointer<QStyleSheetBorderData> *this_02;
  QPalette *pQVar1;
  undefined8 uVar2;
  QSizeF QVar3;
  QPalettePrivate *pQVar4;
  undefined4 uVar5;
  char cVar6;
  bool bVar7;
  bool bVar8;
  int i;
  int iVar9;
  QStyleSheetGeometryData *ptr;
  QStyleSheetPositionData *ptr_00;
  long lVar10;
  QStyleSheetBoxData *this_03;
  QStyleSheetBorderData *pQVar11;
  QStyleSheetOutlineData *this_04;
  QStyleSheetBackgroundData *pQVar12;
  QStyleSheetPaletteData *this_05;
  QStyleSheetImageData *pQVar13;
  char *pcVar14;
  QStyleSheetBorderImageData *pQVar15;
  QColor *pQVar16;
  QSize QVar17;
  QVariant *pQVar18;
  QObject *object_00;
  QStyleSheetStyle *this_06;
  char16_t *pcVar19;
  undefined8 *puVar20;
  QBrush *this_07;
  int i_3;
  ulong uVar21;
  long in_FS_OFFSET;
  undefined1 auVar22 [16];
  QLatin1StringView s;
  QLatin1StringView s_00;
  QLatin1StringView s_01;
  QStringView s_02;
  QStringView s_03;
  QLatin1StringView s_04;
  QByteArrayView layout;
  qreal emexSize;
  QFontMetrics fontMetrics;
  QLatin1String local_288;
  int adj;
  QSize local_268;
  QIcon icon;
  QSize local_258;
  QIcon imgIcon;
  QBrush accent;
  QBrush placeHolderTextForeground;
  QBrush alternateBackground;
  QBrush selectedBackground;
  QBrush selectedForeground;
  QBrush foreground;
  Origin clip;
  Attachment attachment;
  QFlagsStorage<Qt::AlignmentFlag> local_210;
  Repeat repeat;
  QArrayDataPointer<char16_t> local_208;
  QBrush brush;
  int spacing;
  PositionMode mode;
  QFlagsStorage<Qt::AlignmentFlag> local_1d8;
  Origin origin;
  int bottom;
  int right;
  int top;
  int left;
  int maxh;
  int maxw;
  int minh;
  int minw;
  int h;
  int w;
  TileMode vertStretch;
  undefined4 uStack_1a4;
  char16_t *pcStack_1a0;
  TileMode horizStretch;
  undefined4 uStack_18c;
  char16_t *local_188;
  qsizetype local_180;
  ValueExtractor v;
  undefined1 local_138 [16];
  anon_union_24_3_e3d07ef4_for_data local_128;
  char *local_110;
  int integer;
  undefined4 uStack_104;
  QVariant *pQStack_100;
  undefined1 *local_f8;
  QArrayDataPointer<char16_t> local_e8;
  char *local_d0;
  undefined1 *local_c8;
  undefined1 *puStack_c0;
  QSize local_b8;
  undefined4 uStack_b0;
  undefined4 uStack_ac;
  undefined4 local_a8;
  undefined4 uStack_a4;
  undefined4 uStack_a0;
  undefined4 uStack_9c;
  QSize local_98;
  undefined1 *puStack_90;
  undefined1 *local_88;
  undefined1 *puStack_80;
  undefined1 *local_78;
  undefined1 *puStack_70;
  undefined1 *local_68;
  undefined1 *puStack_60;
  undefined1 *local_58;
  undefined1 *puStack_50;
  undefined1 *local_48;
  undefined1 *puStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this->features = 0;
  this_07 = &this->defaultBackground;
  QBrush::QBrush(this_07);
  this_00 = &this->font;
  QFont::QFont(this_00);
  this->hasFont = false;
  (this->styleHints).d = (Data *)0x0;
  (this->pal).d.ptr = (QStyleSheetPaletteData *)0x0;
  (this->b).d.ptr = (QStyleSheetBoxData *)0x0;
  (this->bg).d.ptr = (QStyleSheetBackgroundData *)0x0;
  (this->bd).d.ptr = (QStyleSheetBorderData *)0x0;
  (this->ou).d.ptr = (QStyleSheetOutlineData *)0x0;
  (this->geo).d.ptr = (QStyleSheetGeometryData *)0x0;
  (this->p).d.ptr = (QStyleSheetPositionData *)0x0;
  (this->img).d.ptr = (QStyleSheetImageData *)0x0;
  (this->iconPtr).d.ptr = (QStyleSheetImageData *)0x0;
  this->clipset = 0;
  QPainterPath::QPainterPath(&this->clipPath);
  local_138._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_138._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QGuiApplication::palette();
  _v = &DAT_aaaaaaaaaaaaaaaa;
  QCss::ValueExtractor::ValueExtractor(&v,(QList_conflict *)declarations,(QPalette *)local_138);
  iVar9 = QCss::ValueExtractor::extractStyleFeatures();
  this->features = iVar9;
  w = -1;
  h = -1;
  minw = -1;
  minh = -1;
  maxw = -1;
  maxh = -1;
  cVar6 = QCss::ValueExtractor::extractGeometry((int *)&v,&w,&h,&minw,&minh,&maxw);
  if (cVar6 != '\0') {
    ptr = (QStyleSheetGeometryData *)operator_new(0x1c);
    (ptr->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i = 0;
    ptr->minWidth = minw;
    ptr->minHeight = minh;
    ptr->width = w;
    ptr->height = h;
    ptr->maxWidth = maxw;
    ptr->maxHeight = maxh;
    QSharedDataPointer<QStyleSheetGeometryData>::reset(&this->geo,ptr);
  }
  left = 0;
  top = 0;
  right = 0;
  bottom = 0;
  origin = Origin_Unknown;
  local_1d8.i = 0;
  mode = PositionMode_Unknown;
  cVar6 = QCss::ValueExtractor::extractPosition
                    ((int *)&v,&left,&top,&right,(Origin *)&bottom,(QFlags *)&origin,&local_1d8.i,
                     (QFlags *)&mode);
  if (cVar6 != '\0') {
    ptr_00 = (QStyleSheetPositionData *)operator_new(0x24);
    (ptr_00->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i = 0;
    ptr_00->left = left;
    ptr_00->top = top;
    ptr_00->bottom = bottom;
    ptr_00->right = right;
    ptr_00->origin = origin;
    (ptr_00->position).super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
    super_QFlagsStorage<Qt::AlignmentFlag>.i = local_1d8.i;
    ptr_00->mode = mode;
    (ptr_00->textAlignment).super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
    super_QFlagsStorage<Qt::AlignmentFlag>.i = 0;
    QSharedDataPointer<QStyleSheetPositionData>::reset(&this->p,ptr_00);
  }
  this_01 = &this->bg;
  this_02 = &this->bd;
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
  local_58 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
  for (lVar10 = 0; lVar10 != 4; lVar10 = lVar10 + 1) {
    *(undefined4 *)((long)&local_58 + lVar10 * 4) = 0;
    *(undefined4 *)((long)&local_48 + lVar10 * 4) = 0;
  }
  cVar6 = QCss::ValueExtractor::extractBox((int *)&v,(int *)&local_48,(int *)&local_58);
  if (cVar6 != '\0') {
    this_03 = (QStyleSheetBoxData *)operator_new(0x28);
    QStyleSheetBoxData::QStyleSheetBoxData(this_03,(int *)&local_48,(int *)&local_58,-1);
    QSharedDataPointer<QStyleSheetBoxData>::reset(&this->b,this_03);
  }
  local_68 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
  local_78 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_70 = &DAT_aaaaaaaaaaaaaaaa;
  local_88 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_80 = &DAT_aaaaaaaaaaaaaaaa;
  lVar10 = 0;
  do {
    QBrush::QBrush((QBrush *)((long)&local_88 + lVar10));
    lVar10 = lVar10 + 8;
  } while (lVar10 != 0x20);
  local_98 = (QSize)&DAT_aaaaaaaaaaaaaaaa;
  puStack_90 = &DAT_aaaaaaaaaaaaaaaa;
  local_a8 = 0xffffffff;
  uStack_a4 = 0xffffffff;
  uStack_a0 = 0xffffffff;
  uStack_9c = 0xffffffff;
  local_b8.wd.m_i = -1;
  local_b8.ht.m_i = -1;
  uStack_b0 = 0xffffffff;
  uStack_ac = 0xffffffff;
  for (lVar10 = 0; lVar10 != 4; lVar10 = lVar10 + 1) {
    *(undefined4 *)((long)&local_68 + lVar10 * 4) = 0;
    (&local_98.wd)[lVar10].m_i = 1;
  }
  cVar6 = QCss::ValueExtractor::extractBorder
                    ((int *)&v,(QBrush *)&local_68,(BorderStyle *)&local_88,&local_98);
  if (cVar6 != '\0') {
    pQVar11 = (QStyleSheetBorderData *)operator_new(0x70);
    QStyleSheetBorderData::QStyleSheetBorderData
              (pQVar11,(int *)&local_68,(QBrush *)&local_88,(BorderStyle *)&local_98,&local_b8);
    QSharedDataPointer<QStyleSheetBorderData>::reset(this_02,pQVar11);
  }
  local_c8 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_c0 = &DAT_aaaaaaaaaaaaaaaa;
  for (lVar10 = 0; lVar10 != 4; lVar10 = lVar10 + 1) {
    *(undefined4 *)((long)&local_c8 + lVar10 * 4) = 0;
    *(undefined4 *)((long)&local_68 + lVar10 * 4) = 0;
    (&local_98.wd)[lVar10].m_i = 1;
  }
  cVar6 = QCss::ValueExtractor::extractOutline
                    ((int *)&v,(QBrush *)&local_68,(BorderStyle *)&local_88,&local_98,
                     (int *)&local_b8);
  if (cVar6 != '\0') {
    this_04 = (QStyleSheetOutlineData *)operator_new(0x80);
    QStyleSheetOutlineData::QStyleSheetOutlineData
              (this_04,(int *)&local_68,(QBrush *)&local_88,(BorderStyle *)&local_98,&local_b8,
               (int *)&local_c8);
    QSharedDataPointer<QStyleSheetOutlineData>::reset(&this->ou,this_04);
  }
  _brush = &DAT_aaaaaaaaaaaaaaaa;
  QBrush::QBrush(&brush);
  local_208.size = 0;
  local_208.d = (Data *)0x0;
  local_208.ptr = (char16_t *)0x0;
  repeat = Repeat_XY;
  local_210.i = 0x21;
  attachment = Attachment_Scroll;
  origin = Origin_Padding;
  cVar6 = QCss::ValueExtractor::extractBackground
                    ((QBrush *)&v,(QString *)&brush,(Repeat *)&local_208,(QFlags *)&repeat,
                     &stack0xfffffffffffffdf0.i,&origin,&attachment);
  if (cVar6 != '\0') {
    local_128._16_4_ = 0xaaaaaaaa;
    local_128._20_4_ = 0xaaaaaaaa;
    local_128._0_4_ = 0xaaaaaaaa;
    local_128._4_4_ = 0xaaaaaaaa;
    local_128._8_4_ = 0xaaaaaaaa;
    local_128._12_4_ = 0xaaaaaaaa;
    QStyleSheetStyle::loadPixmap((QStyleSheetStyle *)local_128.data,(QString *)&local_208,object);
    if ((local_208.size != 0) && (cVar6 = QPixmap::isNull(), cVar6 != '\0')) {
      local_e8.d._0_4_ = 2;
      local_e8.size._4_4_ = 0;
      local_e8.d._4_4_ = 0;
      local_e8.ptr._0_4_ = Active;
      local_e8.ptr._4_4_ = 0;
      local_e8.size._0_4_ = 0;
      local_d0 = "default";
      QDir::toNativeSeparators((QString *)&horizStretch);
      QString::toLocal8Bit((QByteArray *)&integer,(QString *)&horizStretch);
      pQVar18 = pQStack_100;
      if (pQStack_100 == (QVariant *)0x0) {
        pQVar18 = (QVariant *)&QByteArray::_empty;
      }
      QMessageLogger::warning((char *)&local_e8,"Could not create pixmap from %s",pQVar18);
      QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&integer);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&horizStretch);
    }
    pQVar12 = (QStyleSheetBackgroundData *)operator_new(0x40);
    QStyleSheetBackgroundData::QStyleSheetBackgroundData
              (pQVar12,&brush,(QPixmap *)local_128.data,repeat,(Alignment)local_210.i,origin,
               attachment,Origin_Border);
    QSharedDataPointer<QStyleSheetBackgroundData>::reset(this_01,pQVar12);
    QPixmap::~QPixmap((QPixmap *)local_128.data);
  }
  _foreground = &DAT_aaaaaaaaaaaaaaaa;
  QBrush::QBrush(&foreground);
  _selectedForeground = &DAT_aaaaaaaaaaaaaaaa;
  QBrush::QBrush(&selectedForeground);
  _selectedBackground = &DAT_aaaaaaaaaaaaaaaa;
  QBrush::QBrush(&selectedBackground);
  _alternateBackground = &DAT_aaaaaaaaaaaaaaaa;
  QBrush::QBrush(&alternateBackground);
  _placeHolderTextForeground = &DAT_aaaaaaaaaaaaaaaa;
  QBrush::QBrush(&placeHolderTextForeground);
  _accent = &DAT_aaaaaaaaaaaaaaaa;
  QBrush::QBrush(&accent);
  cVar6 = QCss::ValueExtractor::extractPalette
                    ((QBrush *)&v,&foreground,&selectedForeground,&selectedBackground,
                     &alternateBackground,&placeHolderTextForeground);
  if (cVar6 != '\0') {
    this_05 = (QStyleSheetPaletteData *)operator_new(0x38);
    QStyleSheetPaletteData::QStyleSheetPaletteData
              (this_05,&foreground,&selectedForeground,&selectedBackground,&alternateBackground,
               &placeHolderTextForeground,&accent);
    QSharedDataPointer<QStyleSheetPaletteData>::reset(&this->pal,this_05);
  }
  imgIcon.d = (QIconPrivate *)&DAT_aaaaaaaaaaaaaaaa;
  QIcon::QIcon(&imgIcon);
  local_210.i = 0x84;
  local_258.wd.m_i = -1;
  local_258.ht.m_i = -1;
  cVar6 = QCss::ValueExtractor::extractImage
                    ((QIcon *)&v,(QFlags *)&imgIcon,(QSize *)&stack0xfffffffffffffdf0);
  if (cVar6 != '\0') {
    pQVar13 = (QStyleSheetImageData *)operator_new(0x20);
    QStyleSheetImageData::QStyleSheetImageData(pQVar13,&imgIcon,(Alignment)local_210.i,&local_258);
    QSharedDataPointer<QStyleSheetImageData>::reset(&this->img,pQVar13);
  }
  icon.d = (QIconPrivate *)&DAT_aaaaaaaaaaaaaaaa;
  QIcon::QIcon(&icon);
  local_268.wd.m_i = -1;
  local_268.ht.m_i = -1;
  cVar6 = QCss::ValueExtractor::extractIcon((QIcon *)&v,(QSize *)&icon);
  if (cVar6 != '\0') {
    pQVar13 = (QStyleSheetImageData *)operator_new(0x20);
    QStyleSheetImageData::QStyleSheetImageData(pQVar13,&icon,(Alignment)0x84,&local_268);
    QSharedDataPointer<QStyleSheetImageData>::reset(&this->iconPtr,pQVar13);
  }
  adj = -0xff;
  bVar7 = (bool)QCss::ValueExtractor::extractFont((QFont *)&v,(int *)this_00);
  this->hasFont = bVar7;
  if (object != (QObject *)0x0) {
    (*(code *)**(undefined8 **)object)(object);
    pcVar14 = (char *)QMetaObject::className();
    iVar9 = qstrcmp(pcVar14,"QTipLabel");
    if (iVar9 == 0) {
      QToolTip::palette();
      uVar5 = local_138._8_4_;
      local_138._8_4_ = (ColorGroup)local_e8.ptr;
      local_e8.ptr._0_4_ = uVar5;
      pQVar4 = (QPalettePrivate *)CONCAT44(local_e8.d._4_4_,local_e8.d._0_4_);
      local_e8.d._0_4_ = (undefined4)local_138._0_8_;
      local_e8.d._4_4_ = SUB84(local_138._0_8_,4);
      local_138._0_8_ = pQVar4;
      QPalette::~QPalette((QPalette *)&local_e8);
    }
  }
  for (uVar21 = 0; uVar21 < (ulong)(declarations->d).size; uVar21 = uVar21 + 1) {
    pQVar1 = (QPalette *)((declarations->d).ptr + uVar21);
    iVar9 = *(int *)(pQVar1->d + 0x20);
    if (iVar9 == 0x54) {
      pQVar12 = QSharedDataPointer::operator_cast_to_QStyleSheetBackgroundData_
                          ((QSharedDataPointer *)this_01);
      if ((pQVar12 == (QStyleSheetBackgroundData *)0x0) ||
         (pQVar12 = QSharedDataPointer<QStyleSheetBackgroundData>::operator->(this_01),
         *(int *)(*(long *)&pQVar12->brush + 4) == 0)) {
        iVar9 = ::QVariant::toInt((bool *)(*(long *)(pQVar1->d + 0x30) + 8));
        if (iVar9 - 0x3b < NColorRoles) {
          pQVar16 = QPalette::color((QPalette *)local_138,iVar9 - 0x3b);
          QBrush::operator=(this_07,*(QColor **)pQVar16);
        }
      }
    }
    else if (iVar9 == 0x43) {
      local_e8.size._0_4_ = 0;
      local_e8.size._4_4_ = 0;
      local_e8.d._0_4_ = 0;
      local_e8.d._4_4_ = 0;
      local_e8.ptr._0_4_ = Active;
      local_e8.ptr._4_4_ = 0;
      horizStretch = 0xaaaaaaaa;
      _vertStretch = (Data *)CONCAT44(uStack_1a4,0xaaaaaaaa);
      _integer = (QIconPrivate *)&DAT_aaaaaaaaaaaaaaaa;
      pQStack_100 = (QVariant *)&DAT_aaaaaaaaaaaaaaaa;
      QCss::Declaration::borderImageValue
                ((QString *)pQVar1,(int *)&local_e8,(TileMode *)&integer,&horizStretch);
      if (CONCAT44(local_e8.size._4_4_,(undefined4)local_e8.size) == 0) {
LAB_0033f4f7:
        pQVar11 = QSharedDataPointer::operator_cast_to_QStyleSheetBorderData_
                            ((QSharedDataPointer *)this_02);
        if (pQVar11 != (QStyleSheetBorderData *)0x0) {
          pQVar11 = QSharedDataPointer<QStyleSheetBorderData>::operator->(this_02);
          pQVar15 = QSharedDataPointer::operator_cast_to_QStyleSheetBorderImageData_
                              ((QSharedDataPointer *)&pQVar11->bi);
          if (pQVar15 != (QStyleSheetBorderImageData *)0x0) {
            QPixmap::QPixmap((QPixmap *)local_128.data);
            pQVar11 = QSharedDataPointer<QStyleSheetBorderData>::operator->(this_02);
            pQVar15 = QSharedDataPointer<QStyleSheetBorderImageData>::operator->(&pQVar11->bi);
            QPixmap::operator=(&pQVar15->pixmap,(QPixmap *)local_128.data);
            QPixmap::~QPixmap((QPixmap *)local_128.data);
          }
        }
      }
      else {
        local_128._0_4_ = 4;
        local_128._4_4_ = 0;
        local_128._8_4_ = 0x5ecc54;
        local_128._12_4_ = 0;
        bVar7 = ::operator==((QString *)&local_e8,(QLatin1StringView *)&local_128);
        if (bVar7) goto LAB_0033f4f7;
        if ((this_02->d).ptr == (QStyleSheetBorderData *)0x0) {
          pQVar11 = (QStyleSheetBorderData *)operator_new(0x70);
          QStyleSheetBorderData::QStyleSheetBorderData(pQVar11);
          QSharedDataPointer<QStyleSheetBorderData>::reset(this_02,pQVar11);
        }
        pQVar11 = QSharedDataPointer<QStyleSheetBorderData>::operator->(this_02);
        if ((pQVar11->bi).d.ptr == (QStyleSheetBorderImageData *)0x0) {
          pQVar15 = (QStyleSheetBorderImageData *)operator_new(0x50);
          QStyleSheetBorderImageData::QStyleSheetBorderImageData(pQVar15);
          pQVar11 = QSharedDataPointer<QStyleSheetBorderData>::operator->(this_02);
          QSharedDataPointer<QStyleSheetBorderImageData>::reset(&pQVar11->bi,pQVar15);
        }
        pQVar11 = QSharedDataPointer<QStyleSheetBorderData>::operator->(this_02);
        pQVar15 = QSharedDataPointer::operator_cast_to_QStyleSheetBorderImageData_
                            ((QSharedDataPointer *)&pQVar11->bi);
        QStyleSheetStyle::loadPixmap((QStyleSheetStyle *)local_128.data,(QString *)&local_e8,object)
        ;
        QPixmap::operator=(&pQVar15->pixmap,(QPixmap *)local_128.data);
        QPixmap::~QPixmap((QPixmap *)local_128.data);
        for (lVar10 = 0; lVar10 != 4; lVar10 = lVar10 + 1) {
          pQVar15->cuts[lVar10] = (&integer)[lVar10];
        }
        pQVar15->horizStretch = horizStretch;
        pQVar15->vertStretch = vertStretch;
      }
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_e8);
    }
    else {
      cVar6 = QString::startsWith((QLatin1String *)(pQVar1->d + 8),10);
      if ((cVar6 == '\0') && (*(int *)(pQVar1->d + 0x20) == 0)) {
        for (lVar10 = 0; lVar10 != 0x2d0; lVar10 = lVar10 + 8) {
          local_288.m_size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
          local_288.m_data = &DAT_aaaaaaaaaaaaaaaa;
          QLatin1String::QLatin1String
                    (&local_288,*(char **)((long)knownStyleHints._M_elems + lVar10));
          bVar7 = ::operator==((QString *)(pQVar1->d + 8),&local_288);
          if (bVar7) {
            local_e8.d._0_4_ = 0;
            local_e8.d._4_4_ = 0;
            local_e8.ptr._0_4_ = Active;
            local_e8.ptr._4_4_ = 0;
            local_e8.size._0_4_ = 0;
            local_e8.size._4_4_ = 0;
            local_d0 = (char *)0x2;
            s.m_data = "alignment";
            s.m_size = 9;
            bVar7 = QLatin1String::endsWith(&local_288,s,CaseSensitive);
            if (bVar7) {
              iVar9 = QCss::Declaration::alignmentValue();
              ::QVariant::QVariant((QVariant *)&local_128,iVar9);
              ::QVariant::operator=((QVariant *)&local_e8,(QVariant *)&local_128);
              ::QVariant::~QVariant((QVariant *)&local_128);
            }
            else {
              s_00.m_data = "color";
              s_00.m_size = 5;
              bVar7 = QLatin1String::endsWith(&local_288,s_00,CaseSensitive);
              if (bVar7) {
                QPalette::QPalette((QPalette *)&horizStretch);
                auVar22 = QCss::Declaration::colorValue(pQVar1);
                _integer = auVar22._0_8_;
                pQStack_100._0_6_ = auVar22._8_6_;
                iVar9 = QColor::rgba();
                ::QVariant::QVariant((QVariant *)&local_128,iVar9);
                ::QVariant::operator=((QVariant *)&local_e8,(QVariant *)&local_128);
                ::QVariant::~QVariant((QVariant *)&local_128);
                QPalette::~QPalette((QPalette *)&horizStretch);
              }
              else {
                s_01.m_data = "size";
                s_01.m_size = 4;
                bVar7 = QLatin1String::endsWith(&local_288,s_01,CaseSensitive);
                if (bVar7) {
                  local_f8 = &DAT_aaaaaaaaaaaaaaaa;
                  _integer = (QIconPrivate *)&DAT_aaaaaaaaaaaaaaaa;
                  pQStack_100 = (QVariant *)&DAT_aaaaaaaaaaaaaaaa;
                  ::QVariant::toString();
                  s_02.m_data = L"em";
                  s_02.m_size = 2;
                  bVar7 = QString::endsWith((QString *)&integer,s_02,CaseInsensitive);
                  if ((bVar7) ||
                     (s_03.m_data = L"ex", s_03.m_size = 2,
                     bVar8 = QString::endsWith((QString *)&integer,s_03,CaseInsensitive), bVar8)) {
                    _vertStretch = (Data *)&DAT_aaaaaaaaaaaaaaaa;
                    pcStack_1a0 = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
                    QFont::QFont((QFont *)&vertStretch,this_00);
                    if ((object != (QObject *)0x0) &&
                       ((this->hasFont == false &&
                        ((*(byte *)(*(long *)(object + 8) + 0x30) & 1) != 0)))) {
                      QFont::operator=((QFont *)&vertStretch,
                                       (QFont *)(*(long *)(object + 0x20) + 0x38));
                    }
                    _fontMetrics = &DAT_aaaaaaaaaaaaaaaa;
                    QFontMetrics::QFontMetrics(&fontMetrics,(QFont *)&vertStretch);
                    if (bVar7) {
                      iVar9 = QFontMetrics::height();
                      pcVar14 = "em";
                    }
                    else {
                      iVar9 = QFontMetrics::xHeight();
                      pcVar14 = "ex";
                    }
                    emexSize = 0.0;
                    cVar6 = QCss::Declaration::realValue((double *)pQVar1,(char *)&emexSize);
                    if ((cVar6 == '\0') || (emexSize <= 0.0)) {
                      local_128._0_4_ = 2;
                      local_128._4_4_ = 0;
                      local_128._8_4_ = 0;
                      local_128._12_4_ = 0;
                      local_128._16_4_ = 0;
                      local_128._20_4_ = 0;
                      local_110 = "default";
                      QString::toLocal8Bit((QByteArray *)&horizStretch,(QString *)&integer);
                      pcVar19 = local_188;
                      if (local_188 == (char16_t *)0x0) {
                        pcVar19 = (char16_t *)&QByteArray::_empty;
                      }
                      QMessageLogger::warning
                                ((char *)local_128.data,"Invalid \'%s\' size for %s. Skipping.",
                                 pcVar14,pcVar19);
                      QArrayDataPointer<char>::~QArrayDataPointer
                                ((QArrayDataPointer<char> *)&horizStretch);
                    }
                    else {
                      local_188 = (char16_t *)(emexSize * (double)iVar9);
                      horizStretch = (TileMode)local_188;
                      uStack_18c = (undefined4)((ulong)local_188 >> 0x20);
                      ::QVariant::fromValue<QSizeF>
                                ((enable_if_t<std::is_copy_constructible_v<QSizeF>_&&_std::is_destructible_v<QSizeF>,_QVariant>
                                  *)&local_128,(QSizeF *)&horizStretch);
                      ::QVariant::operator=((QVariant *)(pQVar1->d + 0x40),(QVariant *)&local_128);
                      ::QVariant::~QVariant((QVariant *)&local_128);
                      QVar3.wd._4_4_ = uStack_18c;
                      QVar3.wd._0_4_ = horizStretch;
                      QVar3.ht = (qreal)local_188;
                      ::QVariant::QVariant((QVariant *)&local_128,QVar3);
                      ::QVariant::operator=((QVariant *)&local_e8,(QVariant *)&local_128);
                      ::QVariant::~QVariant((QVariant *)&local_128);
                    }
                    QFontMetrics::~QFontMetrics(&fontMetrics);
                    QFont::~QFont((QFont *)&vertStretch);
                  }
                  else {
                    QVar17 = (QSize)QCss::Declaration::sizeValue();
                    ::QVariant::QVariant((QVariant *)&local_128,QVar17);
                    ::QVariant::operator=((QVariant *)&local_e8,(QVariant *)&local_128);
                    ::QVariant::~QVariant((QVariant *)&local_128);
                  }
                  QArrayDataPointer<char16_t>::~QArrayDataPointer
                            ((QArrayDataPointer<char16_t> *)&integer);
                }
                else {
                  s_04.m_data = "icon";
                  s_04.m_size = 4;
                  bVar7 = QLatin1String::endsWith(&local_288,s_04,CaseSensitive);
                  if (bVar7) {
                    QCss::Declaration::iconValue();
                    QIcon::operator_cast_to_QVariant((QVariant *)&local_128,(QIcon *)&integer);
                    ::QVariant::operator=((QVariant *)&local_e8,(QVariant *)&local_128);
                    ::QVariant::~QVariant((QVariant *)&local_128);
                    QIcon::~QIcon((QIcon *)&integer);
                  }
                  else {
                    local_128._0_4_ = 0xd;
                    local_128._4_4_ = 0;
                    local_128._8_4_ = 0x5f6138;
                    local_128._12_4_ = 0;
                    bVar7 = ::comparesEqual(&local_288,(QLatin1StringView *)&local_128);
                    if (((bVar7) && (*(long *)(pQVar1->d + 0x38) != 0)) &&
                       (**(int **)(pQVar1->d + 0x30) == 4)) {
                      ::QVariant::toString();
                      QString::toLatin1_helper_inplace((QString *)&horizStretch);
                      layout.m_data = (storage_type *)local_188;
                      layout.m_size = local_180;
                      subControlLayout((QList<QVariant> *)&integer,layout);
                      ::QVariant::QVariant((QVariant *)&local_128,(QList_conflict *)&integer);
                      ::QVariant::operator=((QVariant *)&local_e8,(QVariant *)&local_128);
                      ::QVariant::~QVariant((QVariant *)&local_128);
                      QArrayDataPointer<QVariant>::~QArrayDataPointer
                                ((QArrayDataPointer<QVariant> *)&integer);
                      QArrayDataPointer<char>::~QArrayDataPointer
                                ((QArrayDataPointer<char> *)&horizStretch);
                      QArrayDataPointer<char16_t>::~QArrayDataPointer
                                ((QArrayDataPointer<char16_t> *)&vertStretch);
                    }
                    else {
                      integer = 0xaaaaaaaa;
                      QCss::Declaration::intValue((int *)pQVar1,(char *)&integer);
                      ::QVariant::QVariant((QVariant *)&local_128,integer);
                      ::QVariant::operator=((QVariant *)&local_e8,(QVariant *)&local_128);
                      ::QVariant::~QVariant((QVariant *)&local_128);
                    }
                  }
                }
              }
            }
            pQVar18 = QHash<QString,_QVariant>::operator[]
                                (&this->styleHints,(QString *)(pQVar1->d + 8));
            ::QVariant::operator=(pQVar18,(QVariant *)&local_e8);
            ::QVariant::~QVariant((QVariant *)&local_e8);
            goto LAB_0033f726;
          }
        }
        local_e8.d._0_4_ = 2;
        local_e8.size._4_4_ = 0;
        local_e8.d._4_4_ = 0;
        local_e8.ptr._0_4_ = Active;
        local_e8.ptr._4_4_ = 0;
        local_e8.size._0_4_ = 0;
        local_d0 = "default";
        QString::toLocal8Bit((QByteArray *)&local_128,(QString *)(pQVar1->d + 8));
        puVar20 = (undefined8 *)CONCAT44(local_128._12_4_,local_128._8_4_);
        if (puVar20 == (undefined8 *)0x0) {
          puVar20 = &QByteArray::_empty;
        }
        QMessageLogger::warning((char *)&local_e8,"Unknown property %s",puVar20);
        QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_128);
      }
    }
LAB_0033f726:
  }
  if ((this_02->d).ptr == (QStyleSheetBorderData *)0x0) goto LAB_0033fe02;
  if ((object != (QObject *)0x0) && ((*(byte *)(*(long *)(object + 8) + 0x30) & 1) != 0)) {
    this_06 = globalStyleSheetStyle;
    if (globalStyleSheetStyle == (QStyleSheetStyle *)0x0) {
      object_00 = &QWidget::style((QWidget *)object)->super_QObject;
      this_06 = QtPrivate::qobject_cast_helper<QStyleSheetStyle*,QObject>(object_00);
      if (this_06 == (QStyleSheetStyle *)0x0) goto LAB_0033fdca;
    }
    iVar9 = QStyleSheetStyle::nativeFrameWidth((QStyleSheetStyle *)this_06,(QWidget *)object);
    fixupBorder(this,iVar9);
  }
LAB_0033fdca:
  if ((((this_02->d).ptr)->bi).d.ptr != (QStyleSheetBorderImageData *)0x0) {
    QBrush::QBrush((QBrush *)&local_e8);
    uVar2 = *(undefined8 *)this_07;
    *(ulong *)this_07 = CONCAT44(local_e8.d._4_4_,local_e8.d._0_4_);
    local_e8.d._0_4_ = (undefined4)uVar2;
    local_e8.d._4_4_ = (undefined4)((ulong)uVar2 >> 0x20);
    QBrush::~QBrush((QBrush *)&local_e8);
  }
LAB_0033fe02:
  QIcon::~QIcon(&icon);
  QIcon::~QIcon(&imgIcon);
  QBrush::~QBrush(&accent);
  QBrush::~QBrush(&placeHolderTextForeground);
  QBrush::~QBrush(&alternateBackground);
  QBrush::~QBrush(&selectedBackground);
  QBrush::~QBrush(&selectedForeground);
  QBrush::~QBrush(&foreground);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_208);
  QBrush::~QBrush(&brush);
  lVar10 = 0x18;
  do {
    QBrush::~QBrush((QBrush *)((long)&local_88 + lVar10));
    lVar10 = lVar10 + -8;
  } while (lVar10 != -8);
  QCss::ValueExtractor::~ValueExtractor(&v);
  QPalette::~QPalette((QPalette *)local_138);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

QRenderRule::QRenderRule(const QList<Declaration> &declarations, const QObject *object)
    : features(0),
      hasFont(false),
      pal(nullptr),
      b(nullptr),
      bg(nullptr),
      bd(nullptr),
      ou(nullptr),
      geo(nullptr),
      p(nullptr),
      img(nullptr),
      clipset(0)
{
    QPalette palette = QGuiApplication::palette(); // ###: ideally widget's palette
    ValueExtractor v(declarations, palette);
    features = v.extractStyleFeatures();

    int w = -1, h = -1, minw = -1, minh = -1, maxw = -1, maxh = -1;
    if (v.extractGeometry(&w, &h, &minw, &minh, &maxw, &maxh))
        geo = new QStyleSheetGeometryData(w, h, minw, minh, maxw, maxh);

    int left = 0, top = 0, right = 0, bottom = 0;
    Origin origin = Origin_Unknown;
    Qt::Alignment position;
    QCss::PositionMode mode = PositionMode_Unknown;
    Qt::Alignment textAlignment;
    if (v.extractPosition(&left, &top, &right, &bottom, &origin, &position, &mode, &textAlignment))
        p = new QStyleSheetPositionData(left, top, right, bottom, origin, position, mode, textAlignment);

    int margins[4], paddings[4], spacing = -1;
    for (int i = 0; i < 4; i++)
        margins[i] = paddings[i] = 0;
    if (v.extractBox(margins, paddings, &spacing))
        b = new QStyleSheetBoxData(margins, paddings, spacing);

    int borders[4];
    QBrush colors[4];
    QCss::BorderStyle styles[4];
    QSize radii[4];
    for (int i = 0; i < 4; i++) {
        borders[i] = 0;
        styles[i] = BorderStyle_None;
    }
    if (v.extractBorder(borders, colors, styles, radii))
        bd = new QStyleSheetBorderData(borders, colors, styles, radii);

    int offsets[4];
    for (int i = 0; i < 4; i++) {
        borders[i] = offsets[i] = 0;
        styles[i] = BorderStyle_None;
    }
    if (v.extractOutline(borders, colors, styles, radii, offsets))
        ou = new QStyleSheetOutlineData(borders, colors, styles, radii, offsets);

    QBrush brush;
    QString uri;
    Repeat repeat = Repeat_XY;
    Qt::Alignment alignment = Qt::AlignTop | Qt::AlignLeft;
    Attachment attachment = Attachment_Scroll;
    origin = Origin_Padding;
    Origin clip = Origin_Border;
    if (v.extractBackground(&brush, &uri, &repeat, &alignment, &origin, &attachment, &clip)) {
        QPixmap pixmap = QStyleSheetStyle::loadPixmap(uri, object);
        if (!uri.isEmpty() && pixmap.isNull())
            qWarning("Could not create pixmap from %s", qPrintable(QDir::toNativeSeparators(uri)));
        bg = new QStyleSheetBackgroundData(brush, pixmap, repeat, alignment, origin, attachment, clip);
    }

    QBrush foreground;
    QBrush selectedForeground;
    QBrush selectedBackground;
    QBrush alternateBackground;
    QBrush placeHolderTextForeground;
    QBrush accent;
    if (v.extractPalette(&foreground, &selectedForeground, &selectedBackground,
                         &alternateBackground, &placeHolderTextForeground, &accent)) {
        pal = new QStyleSheetPaletteData(foreground, selectedForeground, selectedBackground,
                                         alternateBackground, placeHolderTextForeground, accent);
    }

    QIcon imgIcon;
    alignment = Qt::AlignCenter;
    QSize imgSize;
    if (v.extractImage(&imgIcon, &alignment, &imgSize))
        img = new QStyleSheetImageData(imgIcon, alignment, imgSize);

    QIcon icon;
    QSize size;
    if (v.extractIcon(&icon, &size))
        iconPtr = new QStyleSheetImageData(icon, Qt::AlignCenter, size);

    int adj = -255;
    hasFont = v.extractFont(&font, &adj);

#if QT_CONFIG(tooltip)
    if (object && qstrcmp(object->metaObject()->className(), "QTipLabel") == 0)
        palette = QToolTip::palette();
#endif

    for (int i = 0; i < declarations.size(); i++) {
        const Declaration& decl = declarations.at(i);
        if (decl.d->propertyId == BorderImage) {
            QString uri;
            QCss::TileMode horizStretch, vertStretch;
            int cuts[4];

            decl.borderImageValue(&uri, cuts, &horizStretch, &vertStretch);
            if (uri.isEmpty() || uri == "none"_L1) {
                if (bd && bd->bi)
                    bd->bi->pixmap = QPixmap();
            } else {
                if (!bd)
                    bd = new QStyleSheetBorderData;
                if (!bd->bi)
                    bd->bi = new QStyleSheetBorderImageData;

                QStyleSheetBorderImageData *bi = bd->bi;
                bi->pixmap = QStyleSheetStyle::loadPixmap(uri, object);
                for (int i = 0; i < 4; i++)
                    bi->cuts[i] = cuts[i];
                bi->horizStretch = horizStretch;
                bi->vertStretch = vertStretch;
            }
        } else if (decl.d->propertyId == QtBackgroundRole) {
            if (bg && bg->brush.style() != Qt::NoBrush)
                continue;
            int role = decl.d->values.at(0).variant.toInt();
            if (role >= Value_FirstColorRole && role <= Value_LastColorRole)
                defaultBackground = palette.color((QPalette::ColorRole)(role-Value_FirstColorRole));
        } else if (decl.d->property.startsWith("qproperty-"_L1, Qt::CaseInsensitive)) {
            // intentionally left blank...
        } else if (decl.d->propertyId == UnknownProperty) {
            bool knownStyleHint = false;
            for (const auto sh : knownStyleHints) {
                QLatin1StringView styleHint(sh);
                if (decl.d->property == styleHint) {
                    QVariant hintValue;
                    if (styleHint.endsWith("alignment"_L1)) {
                        hintValue = (int) decl.alignmentValue();
                    } else if (styleHint.endsWith("color"_L1)) {
                        hintValue = (int) decl.colorValue().rgba();
                    } else if (styleHint.endsWith("size"_L1)) {
                        // Check only for the 'em' case
                        const QString valueString = decl.d->values.at(0).variant.toString();
                        const bool isEmSize = valueString.endsWith(u"em", Qt::CaseInsensitive);
                        if (isEmSize || valueString.endsWith(u"ex", Qt::CaseInsensitive)) {
                            // 1em == size of font; 1ex == xHeight of font
                            // See lengthValueFromData helper in qcssparser.cpp
                            QFont fontForSize(font);
                            // if no font is specified, then use the widget font if possible
                            if (const QWidget *widget; !hasFont && (widget = qobject_cast<const QWidget*>(object)))
                                fontForSize = widget->font();

                            const QFontMetrics fontMetrics(fontForSize);
                            qreal pixelSize = isEmSize ? fontMetrics.height() : fontMetrics.xHeight();

                            // Transform size according to the 'em'/'ex' value
                            qreal emexSize = {};
                            if (decl.realValue(&emexSize, isEmSize ? "em" : "ex") && emexSize > 0) {
                                pixelSize *= emexSize;
                                const QSizeF newSize(pixelSize, pixelSize);
                                decl.d->parsed = QVariant::fromValue<QSizeF>(newSize);
                                hintValue = newSize;
                            } else {
                                qWarning("Invalid '%s' size for %s. Skipping.",
                                         isEmSize ? "em" : "ex", qPrintable(valueString));
                            }
                        } else {
                            // Normal case where we receive a 'px' or 'pt' unit
                            hintValue = decl.sizeValue();
                        }
                    } else if (styleHint.endsWith("icon"_L1)) {
                        hintValue = decl.iconValue();
                    } else if (styleHint == "button-layout"_L1 && decl.d->values.size() != 0
                               && decl.d->values.at(0).type == QCss::Value::String) {
                        hintValue = subControlLayout(decl.d->values.at(0).variant.toString().toLatin1());
                    } else {
                        int integer;
                        decl.intValue(&integer);
                        hintValue = integer;
                    }
                    styleHints[decl.d->property] = hintValue;
                    knownStyleHint = true;
                    break;
                }
            }
            if (!knownStyleHint)
                qWarning("Unknown property %s", qPrintable(decl.d->property));
        }
    }

    if (hasBorder()) {
        if (const QWidget *widget = qobject_cast<const QWidget *>(object)) {
            QStyleSheetStyle *style = const_cast<QStyleSheetStyle *>(globalStyleSheetStyle);
            if (!style)
                style = qt_styleSheet(widget->style());
            if (style)
                fixupBorder(style->nativeFrameWidth(widget));
        }
        if (border()->hasBorderImage())
            defaultBackground = QBrush();
    }
}